

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl
          (MessageGenerator *this,Printer *p)

{
  pointer *pppFVar1;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *fields;
  byte bVar2;
  ushort uVar3;
  pointer ppFVar4;
  FieldDescriptor *pFVar5;
  FieldDescriptor *field_00;
  iterator __position;
  ushort *puVar6;
  long *plVar7;
  FieldChunk *pFVar8;
  MessageGenerator *this_00;
  FieldChunk *pFVar9;
  Printer *pPVar10;
  bool bVar11;
  bool bVar12;
  HasbitMode HVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  uint32_t uVar17;
  uint uVar18;
  ChunkIterator CVar19;
  undefined7 extraout_var;
  optional<float> oVar20;
  FieldGenerator *this_01;
  FieldDescriptor **ppFVar21;
  Nonnull<const_char_*> pcVar22;
  long *plVar23;
  Options *in_RCX;
  FieldChunk *pFVar24;
  undefined8 uVar25;
  int iVar26;
  long lVar27;
  char *pcVar28;
  _Optional_payload_base<int> options;
  ChunkIterator it;
  pointer ppFVar29;
  string_view prefix;
  string_view prefix_00;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  string_view format_03;
  string_view format_04;
  string_view format_05;
  string_view format_06;
  string_view format_07;
  string_view format_08;
  string_view format_09;
  string_view format_10;
  string_view format_11;
  undefined1 in_stack_fffffffffffffb18;
  Printer *p_local;
  uint local_4d8;
  char local_4d1;
  MessageGenerator *local_4d0;
  int cached_has_word_index;
  _Optional_payload_base<int> local_4c0;
  Sub *local_4b8;
  anon_class_1_0_00000001 local_4a9;
  Formatter format;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1039:28)>
  v;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_470;
  value_type oneof;
  FieldChunk *local_458;
  ChunkIterator local_450;
  vector<int,_std::allocator<int>_> *local_448;
  int local_43c;
  undefined8 *local_438;
  undefined8 local_430;
  undefined1 local_428;
  undefined7 uStack_427;
  undefined8 uStack_420;
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  chunks;
  string local_400;
  string local_3e0;
  Iterator __begin3;
  undefined1 local_3b0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3a0;
  FieldChunk *local_390;
  LogMessageFatal local_388;
  undefined1 local_378 [32];
  undefined1 local_358 [56];
  Iterator __end3;
  FieldDescriptor *field;
  _Alloc_hider local_308;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_300 [10];
  Sub local_258;
  Sub local_1a0;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  long *local_c8;
  undefined8 uStack_c0;
  code *local_b8;
  code *local_b0;
  undefined1 local_a8;
  undefined1 *local_a0;
  undefined8 local_98;
  undefined1 local_90 [16];
  undefined1 local_80;
  undefined1 local_38;
  _Optional_payload_base<int> has_array_index;
  
  options = (_Optional_payload_base<int>)&this->options_;
  p_local = p;
  local_4d0 = this;
  SimpleBaseClass_abi_cxx11_((string *)&field,(cpp *)this->descriptor_,(Descriptor *)options,in_RCX)
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field != local_300) {
    operator_delete(field,local_300[0]._M_allocated_capacity + 1);
  }
  if (local_308._M_p != (pointer)0x0) {
    return;
  }
  format.printer_ = p_local;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.capacity_ =
       0;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.size_ = 0;
  format.vars_.
  super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .
  super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  .settings_.
  super_CompressedTupleImpl<absl::lts_20250127::container_internal::CompressedTuple<absl::lts_20250127::container_internal::CommonFields,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
  .super_Storage<absl::lts_20250127::container_internal::CommonFields,_0UL,_false>.value.
  heap_or_soo_.heap.control = absl::lts_20250127::container_internal::kEmptyGroup + 0x10;
  format_00._M_str =
       "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const $pb$::MessageLite& from_msg) {\n$WeakDescriptorSelfPin$  auto* const _this = static_cast<$classname$*>(&to_msg);\n  auto& from = static_cast<const $classname$&>(from_msg);\n"
  ;
  format_00._M_len = 0xe7;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (p_local,(Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),&format.vars_,format_00);
  (format.printer_)->indent_ =
       (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
  bVar11 = RequiresArena(local_4d0,kMergeFrom);
  if (bVar11) {
    io::Printer::Emit(p_local,0,0,0x33,"\n      $pb$::Arena* arena = _this->GetArena();\n    ");
  }
  format_01._M_str =
       "$annotate_mergefrom$// @@protoc_insertion_point(class_specific_merge_from_start:$full_name$)\n"
  ;
  format_01._M_len = 0x5d;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_01);
  format_02._M_str = "$DCHK$_NE(&from, _this);\n";
  format_02._M_len = 0x19;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_02);
  format_03._M_str = "$uint32$ cached_has_bits = 0;\n(void) cached_has_bits;\n\n";
  format_03._M_len = 0x37;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_03);
  bVar11 = ShouldSplit(local_4d0->descriptor_,(Options *)options);
  if (bVar11) {
    format_04._M_str =
         "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n  _this->PrepareSplitMessageForWrite();\n}\n"
    ;
    format_04._M_len = 99;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (format.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&format.vars_,format_04);
  }
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  chunks.
  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppFVar4 = (local_4d0->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  local_4c0 = options;
  CVar19._M_current =
       chunks.
       super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_458 = chunks.
              super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = local_4d0;
  for (ppFVar29 = (local_4d0->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start; local_4d0 = this_00,
      chunks.
      super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
      ._M_impl.super__Vector_impl_data._M_start = CVar19._M_current,
      chunks.
      super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
      ._M_impl.super__Vector_impl_data._M_finish = local_458, ppFVar29 != ppFVar4;
      ppFVar29 = ppFVar29 + 1) {
    pFVar5 = *ppFVar29;
    field = pFVar5;
    if (CVar19._M_current == local_458) {
LAB_00de215d:
      bVar11 = protobuf::internal::cpp::HasHasbit(field);
      v.storage_.is_callback_engaged_ = bVar11;
      local_388.super_LogMessage.errno_saver_.saved_errno_._0_1_ =
           IsRarelyPresent(field,(Options *)options);
      bVar11 = ShouldSplit(field,(Options *)options);
      __begin3.idx = CONCAT31(__begin3.idx._1_3_,bVar11);
      std::
      vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
      ::emplace_back<bool,bool,bool>
                ((vector<google::protobuf::compiler::cpp::FieldChunk,std::allocator<google::protobuf::compiler::cpp::FieldChunk>>
                  *)&chunks,(bool *)&v,(bool *)&local_388,(bool *)&__begin3);
    }
    else {
      field_00 = local_458[-1].fields.
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish[-1];
      iVar14 = HasBitIndex(this_00,field_00);
      options = local_4c0;
      iVar26 = iVar14 + 7;
      if (-1 < iVar14) {
        iVar26 = iVar14;
      }
      iVar26 = iVar26 >> 3;
      if (iVar14 == -1) {
        iVar26 = -1;
      }
      iVar15 = HasBitIndex(this_00,pFVar5);
      iVar14 = iVar15 + 7;
      if (-1 < iVar15) {
        iVar14 = iVar15;
      }
      iVar14 = iVar14 >> 3;
      if (iVar15 == -1) {
        iVar14 = -1;
      }
      if (iVar26 != iVar14) goto LAB_00de215d;
      bVar11 = IsLikelyPresent(field_00,(Options *)options);
      bVar12 = IsLikelyPresent(pFVar5,(Options *)options);
      if (bVar11 != bVar12) goto LAB_00de215d;
      bVar11 = ShouldSplit(field_00,(Options *)options);
      bVar12 = ShouldSplit(pFVar5,(Options *)options);
      if (bVar11 != bVar12) goto LAB_00de215d;
    }
    __position._M_current =
         chunks.
         super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        chunks.
        super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)&chunks.
                     super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                     ._M_impl.super__Vector_impl_data._M_finish[-1].fields,__position,&field);
    }
    else {
      *__position._M_current = field;
      pppFVar1 = &chunks.
                  super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].fields.
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    CVar19._M_current =
         chunks.
         super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_458 = chunks.
                super__Vector_base<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    this_00 = local_4d0;
  }
  cached_has_word_index = -1;
  if (CVar19._M_current != local_458) {
    local_448 = &this_00->has_bit_indices_;
    local_4b8 = (Sub *)&this_00->field_generators_;
    pFVar8 = CVar19._M_current;
    it._M_current = CVar19._M_current;
LAB_00de224f:
    do {
      iVar26 = cached_has_word_index;
      pFVar24 = pFVar8 + 1;
      local_450._M_current = local_458;
      if (((pFVar24 != local_458) &&
          (CVar19._M_current = CVar19._M_current + 1, local_450._M_current = CVar19._M_current,
          (it._M_current)->has_hasbit == pFVar24->has_hasbit)) &&
         ((it._M_current)->is_rarely_present == pFVar8[1].is_rarely_present)) {
        pFVar9 = pFVar8 + 1;
        local_450._M_current = pFVar24;
        pFVar8 = pFVar24;
        if ((it._M_current)->should_split == pFVar9->should_split) goto LAB_00de224f;
      }
      field = (FieldDescriptor *)local_300;
      has_array_index = (_Optional_payload_base<int>)&field;
      std::__cxx11::string::_M_construct<char_const*>((string *)has_array_index,"from.","");
      local_4d1 = cpp::anon_unknown_0::MaybeEmitHaswordsCheck
                            (it,local_450,(Options *)options,local_448,iVar26,
                             (string *)has_array_index,p_local);
      CVar19._M_current = it._M_current;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)field != local_300) {
        operator_delete(field,local_300[0]._M_allocated_capacity + 1);
      }
      while (CVar19._M_current != local_450._M_current) {
        ppFVar29 = ((CVar19._M_current)->fields).
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        uVar16 = HasBitIndex(local_4d0,*ppFVar29);
        if (((uVar16 < 0xfffffff1) || ((0x40ffU >> (uVar16 + 0xf & 0x1f) & 1) == 0)) &&
           (ppFVar4 = ((CVar19._M_current)->fields).
                      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
           8 < (ulong)((long)ppFVar4 - (long)ppFVar29))) {
          bVar11 = IsLikelyPresent(ppFVar4[-1],(Options *)options);
          local_4d8 = (uint)CONCAT71(extraout_var,bVar11) ^ 1;
        }
        else {
          local_4d8 = 0;
        }
        fields = &(CVar19._M_current)->fields;
        cpp::anon_unknown_0::DebugAssertUniformLikelyPresence(fields,(Options *)options);
        iVar26 = cached_has_word_index;
        if ((7 < uVar16 + 0xf) && (uVar16 != 0xffffffff)) {
          iVar15 = HasBitIndex(local_4d0,
                               *(fields->
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                )._M_impl.super__Vector_impl_data._M_start);
          iVar14 = iVar15 + 0x1f;
          if (-1 < iVar15) {
            iVar14 = iVar15;
          }
          iVar14 = iVar14 >> 5;
          if (iVar15 == -1) {
            iVar14 = -1;
          }
          if (iVar26 != iVar14) {
            cached_has_word_index = iVar14;
            Formatter::operator()
                      (&format,"cached_has_bits = from.$has_bits$[$1$];\n",&cached_has_word_index);
          }
        }
        if ((char)local_4d8 != '\0') {
          uVar17 = GenChunkMask(fields,local_448);
          iVar26 = 0;
          uVar16 = uVar17;
          if (uVar17 != 0) {
            do {
              iVar26 = iVar26 + (uVar16 & 1);
              bVar11 = 1 < uVar16;
              uVar16 = uVar16 >> 1;
            } while (bVar11);
          }
          if (iVar26 < 2) {
            pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (2,(long)iVar26,"2 <= popcnt(chunk_mask)");
          }
          else {
            pcVar22 = (Nonnull<const_char_*>)0x0;
          }
          if (pcVar22 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&field,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                       ,0x10ee,pcVar22);
LAB_00de304d:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&field);
          }
          uVar18 = 0;
          uVar16 = uVar17;
          if (uVar17 != 0) {
            do {
              uVar18 = uVar18 + (uVar16 & 1);
              bVar11 = 1 < uVar16;
              uVar16 = uVar16 >> 1;
            } while (bVar11);
          }
          if ((int)uVar18 < 9) {
            pcVar22 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (8,(ulong)uVar18,"8 >= popcnt(chunk_mask)");
          }
          if (pcVar22 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&field,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                       ,0x10ef,pcVar22);
            goto LAB_00de304d;
          }
          oVar20 = GetFieldGroupPresenceProbability(fields,(Options *)options);
          cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbability_abi_cxx11_
                    ((string *)&field,(_anonymous_namespace_ *)(ulong)uVar17,
                     (uint32_t)
                     oVar20.super__Optional_base<float,_true,_true>._M_payload.
                     super__Optional_payload_base<float>._M_payload,(optional<float>)0x1,false,
                     (optional<int>)has_array_index);
          Formatter::operator()(&format,"if ($1$) {\n",(string *)&field);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)field != local_300) {
            operator_delete(field,local_300[0]._M_allocated_capacity + 1);
          }
          (format.printer_)->indent_ =
               (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
        }
        ppFVar4 = ((CVar19._M_current)->fields).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        local_390 = CVar19._M_current;
        for (ppFVar29 = ((CVar19._M_current)->fields).
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_start; pFVar8 = local_390,
            options = local_4c0, ppFVar29 != ppFVar4; ppFVar29 = ppFVar29 + 1) {
          pFVar5 = *ppFVar29;
          this_01 = FieldGeneratorTable::get((FieldGeneratorTable *)local_4b8,pFVar5);
          bVar2 = pFVar5->field_0x1;
          bVar11 = (bool)((bVar2 & 0x20) >> 5);
          if (0xbf < bVar2 == bVar11) {
            pcVar22 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                (bVar11,0xbf < bVar2,
                                 "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar22 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&field,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar22);
            goto LAB_00de304d;
          }
          if ((pFVar5->field_0x1 & 0x20) == 0) {
            bVar11 = FieldDescriptor::is_required(pFVar5);
            if (!bVar11) {
              bVar2 = pFVar5->field_0x1;
              bVar11 = (bool)((bVar2 & 0x20) >> 5);
              if (0xbf < bVar2 == bVar11) {
                pcVar22 = (Nonnull<const_char_*>)0x0;
              }
              else {
                pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                    (bVar11,0xbf < bVar2,
                                     "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED")
                ;
              }
              if (pcVar22 != (Nonnull<const_char_*>)0x0) {
                absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                          ((LogMessageFatal *)&field,
                           "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                           ,0xb54,pcVar22);
                goto LAB_00de304d;
              }
              if (((pFVar5->field_0x1 & 0x20) == 0) &&
                 (bVar11 = protobuf::internal::cpp::HasHasbit(pFVar5), pPVar10 = p_local, !bVar11))
              {
                bVar11 = ShouldSplit(pFVar5,(Options *)local_4c0);
                local_358._8_8_ = &p_local;
                local_358._24_8_ =
                     absl::lts_20250127::internal_any_invocable::
                     LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__0&>
                ;
                local_358._16_8_ = absl::lts_20250127::internal_any_invocable::LocalManagerTrivial;
                prefix._M_str = (char *)pFVar5;
                prefix._M_len = (size_t)"from.";
                has_array_index = local_4c0;
                local_358._0_8_ = this_01;
                cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                          ((anon_unknown_0 *)pPVar10,(Printer *)&DAT_00000005,prefix,
                           (FieldDescriptor *)(ulong)bVar11,local_4c0._M_payload._0_1_,
                           (Options *)local_358,(AnyInvocable<void_()> *)0x1,
                           (bool)in_stack_fffffffffffffb18);
                (*(code *)local_358._16_8_)(1,(Options *)local_358,(Options *)local_358);
                goto LAB_00de28d8;
              }
            }
            iVar26 = cached_has_word_index;
            if ((pFVar5->options_->field_0)._impl_.weak_ == false) {
              iVar15 = HasBitIndex(local_4d0,pFVar5);
              iVar14 = iVar15 + 0x1f;
              if (-1 < iVar15) {
                iVar14 = iVar15;
              }
              iVar14 = iVar14 >> 5;
              if (iVar15 == -1) {
                iVar14 = -1;
              }
              if (iVar26 == iVar14) {
                bVar11 = protobuf::internal::cpp::HasHasbit(pFVar5);
                if ((!bVar11) &&
                   (absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              (&local_388,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                               ,0x1111,"HasHasbit(field)"), !bVar11)) {
                  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_388);
                }
                if ((pFVar5->field_0x1 & 8) == 0) {
                  ppFVar21 = &pFVar5->containing_type_->fields_;
                }
                else if ((pFVar5->scope_).extension_scope == (Descriptor *)0x0) {
                  ppFVar21 = &pFVar5->file_->extensions_;
                }
                else {
                  ppFVar21 = &((pFVar5->scope_).extension_scope)->extensions_;
                }
                iVar26 = (local_448->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start
                         [(int)((ulong)((long)pFVar5 - (long)*ppFVar21) >> 3) * -0x45d1745d];
                oVar20 = GetPresenceProbability(pFVar5,(Options *)local_4c0);
                cpp::(anonymous_namespace)::GenerateConditionMaybeWithProbability_abi_cxx11_
                          ((string *)&field,
                           (_anonymous_namespace_ *)(ulong)(uint)(1 << ((byte)iVar26 & 0x1f)),
                           (uint32_t)
                           oVar20.super__Optional_base<float,_true,_true>._M_payload.
                           super__Optional_payload_base<float>._M_payload,(optional<float>)0x1,false
                           ,(optional<int>)has_array_index);
                Formatter::operator()(&format,"if ($1$) {\n",(string *)&field);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)field != local_300) {
                  operator_delete(field,local_300[0]._M_allocated_capacity + 1);
                }
                (format.printer_)->indent_ =
                     (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
                HVar13 = protobuf::internal::cpp::GetFieldHasbitMode(pFVar5);
                pPVar10 = p_local;
                if (HVar13 == kHintHasbit) {
                  bVar11 = ShouldSplit(pFVar5,(Options *)local_4c0);
                  local_378._8_8_ = &p_local;
                  local_378._24_8_ =
                       absl::lts_20250127::internal_any_invocable::
                       LocalInvoker<false,void,google::protobuf::compiler::cpp::MessageGenerator::GenerateClassSpecificMergeImpl(google::protobuf::io::Printer*)::__1&>
                  ;
                  local_378._16_8_ = absl::lts_20250127::internal_any_invocable::LocalManagerTrivial
                  ;
                  prefix_00._M_str = (char *)pFVar5;
                  prefix_00._M_len = (size_t)"from.";
                  local_378._0_8_ = this_01;
                  cpp::anon_unknown_0::MayEmitMutableIfNonDefaultCheck
                            ((anon_unknown_0 *)pPVar10,(Printer *)&DAT_00000005,prefix_00,
                             (FieldDescriptor *)(ulong)bVar11,local_4c0._M_payload._0_1_,
                             (Options *)local_378,(AnyInvocable<void_()> *)0x0,
                             (bool)in_stack_fffffffffffffb18);
                  (*(code *)local_378._16_8_)(1,(Options *)local_378,(Options *)local_378);
                }
                else {
                  HVar13 = protobuf::internal::cpp::GetFieldHasbitMode(pFVar5);
                  if (HVar13 != kTrueHasbit) {
                    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                              ((LogMessageFatal *)&field,
                               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                               ,0x111f,"GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit");
                    goto LAB_00de304d;
                  }
                  if ((char)local_4d8 != '\0') {
                    bVar2 = pFVar5->field_0x1;
                    bVar11 = (bool)((bVar2 & 0x20) >> 5);
                    if (0xbf < bVar2 == bVar11) {
                      pcVar22 = (Nonnull<const_char_*>)0x0;
                    }
                    else {
                      pcVar22 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                                          (bVar11,0xbf < bVar2,
                                           "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED"
                                          );
                    }
                    if (pcVar22 != (Nonnull<const_char_*>)0x0) {
                      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                                ((LogMessageFatal *)&field,
                                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                                 ,0xb54,pcVar22);
                      goto LAB_00de304d;
                    }
                    if (((pFVar5->field_0x1 & 0x28) == 0) &&
                       (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar5->type_ * 4) - 1U
                        < 8)) {
                      FieldGenerator::GenerateCopyConstructorCode(this_01,p_local);
                      goto LAB_00de28ae;
                    }
                  }
                  FieldGenerator::GenerateMergingCode(this_01,p_local);
                }
LAB_00de28ae:
                io::Printer::Outdent(format.printer_);
                format_07._M_str = "}\n";
                format_07._M_len = 2;
                has_array_index =
                     (_Optional_payload_base<int>)((long)"OptionalGroup <\n \n}\n" + 0x12);
                io::Printer::
                FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                          (format.printer_,
                           (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )ZEXT816(0),&format.vars_,format_07);
                goto LAB_00de28d8;
              }
            }
            pPVar10 = p_local;
            HasBitVars_abi_cxx11_
                      ((flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&field,local_4d0,pFVar5);
            io::Printer::
            WithVars<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>,void,void>
                      (&v,pPVar10,
                       (flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&field);
            absl::lts_20250127::container_internal::
            raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&field);
            format_05._M_str = "if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) {\n";
            format_05._M_len = 0x3e;
            io::Printer::
            FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                      (format.printer_,
                       (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )ZEXT816(0),&format.vars_,format_05);
            (format.printer_)->indent_ =
                 (format.printer_)->indent_ + ((format.printer_)->options_).spaces_per_indent;
            FieldGenerator::GenerateMergingCode(this_01,p_local);
            io::Printer::Outdent(format.printer_);
            format_06._M_str = "}\n";
            format_06._M_len = 2;
            has_array_index = (_Optional_payload_base<int>)((long)"OptionalGroup <\n \n}\n" + 0x12);
            io::Printer::
            FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                      (format.printer_,
                       (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )ZEXT816(0),&format.vars_,format_06);
            if (v.storage_.is_callback_engaged_ == true) {
              std::
              vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
              ::pop_back((vector<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>,_std::allocator<std::function<std::optional<google::protobuf::io::Printer::ValueImpl<false>_>_(std::basic_string_view<char,_std::char_traits<char>_>)>_>_>
                          *)((long)v.storage_.callback_buffer_ + 0x98));
              v.storage_._0_8_ = v.storage_._0_8_ & 0xffffffffffffff00;
            }
          }
          else {
            FieldGenerator::GenerateMergingCode(this_01,p_local);
          }
LAB_00de28d8:
        }
        if ((char)local_4d8 != '\0') {
          io::Printer::Outdent(format.printer_);
          format_08._M_str = "}\n";
          format_08._M_len = 2;
          has_array_index = (_Optional_payload_base<int>)((long)"OptionalGroup <\n \n}\n" + 0x12);
          io::Printer::
          FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                    (format.printer_,
                     (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )ZEXT816(0),&format.vars_,format_08);
        }
        CVar19._M_current = pFVar8 + 1;
      }
      if (local_4d1 != '\0') {
        io::Printer::Outdent(p_local);
        io::Printer::Emit(p_local,0,0,0x11,"\n        }\n      ");
        cached_has_word_index = -1;
      }
      pFVar8 = CVar19._M_current;
      it._M_current = CVar19._M_current;
    } while (CVar19._M_current != local_458);
  }
  iVar26 = local_4d0->max_has_bit_index_;
  if (iVar26 - 1U < 0x20) {
    pcVar28 = "\n      _this->$has_bits$[0] |= cached_has_bits;\n    ";
    uVar25 = 0x34;
  }
  else {
    iVar14 = iVar26 + 0x3e;
    if (-1 < iVar26 + 0x1f) {
      iVar14 = iVar26 + 0x1f;
    }
    if ((uint)(iVar14 >> 5) < 2) goto LAB_00de2ac2;
    pcVar28 = "\n      _this->$has_bits$.Or(from.$has_bits$);\n    ";
    uVar25 = 0x32;
  }
  io::Printer::Emit(p_local,0,0,uVar25,pcVar28);
LAB_00de2ac2:
  __begin3.descriptor = local_4d0->descriptor_;
  __begin3.idx = 0;
  __end3.idx = (__begin3.descriptor)->real_oneof_decl_count_;
  local_4b8 = &local_1a0;
  __end3.descriptor = __begin3.descriptor;
  while( true ) {
    bVar11 = cpp::operator==(&__begin3,&__end3);
    if (bVar11) break;
    oneof = OneOfRangeImpl::Iterator::operator*(&__begin3);
    pPVar10 = p_local;
    local_3e0._M_dataplus._M_p = (pointer)&local_3e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_3e0,"name","");
    puVar6 = (ushort *)(oneof->all_names_).payload_;
    local_358._40_8_ = ZEXT28(*puVar6);
    local_358._48_8_ = (long)puVar6 + ~local_358._40_8_;
    io::Printer::Sub::Sub<std::basic_string_view<char,std::char_traits<char>>>
              ((Sub *)&field,&local_3e0,
               (basic_string_view<char,_std::char_traits<char>_> *)(local_358 + 0x28));
    local_400._M_dataplus._M_p = (pointer)&local_400.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_400,"NAME","");
    puVar6 = (ushort *)(oneof->all_names_).payload_;
    uVar3 = *puVar6;
    v.storage_._0_8_ = &local_470;
    v.storage_.callback_buffer_[0] = '\0';
    v.storage_.callback_buffer_[1] = '\0';
    v.storage_.callback_buffer_[2] = '\0';
    v.storage_.callback_buffer_[3] = '\0';
    v.storage_.callback_buffer_[4] = '\0';
    v.storage_.callback_buffer_[5] = '\0';
    v.storage_.callback_buffer_[6] = '\0';
    v.storage_.callback_buffer_[7] = '\0';
    local_470._M_local_buf[0] = '\0';
    std::__cxx11::string::resize((ulong)&v,(char)uVar3);
    absl::lts_20250127::ascii_internal::AsciiStrToUpper
              ((Nonnull<char_*>)v.storage_._0_8_,
               (Nullable<const_char_*>)((long)puVar6 + ~(ulong)uVar3),(ulong)uVar3);
    io::Printer::Sub::Sub<std::__cxx11::string>
              (&local_258,&local_400,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&v);
    local_3b0._0_8_ = &local_3a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"index","");
    local_43c = (int)((ulong)((long)oneof - (long)oneof->containing_type_->oneof_decls_) >> 3) *
                -0x49249249;
    io::Printer::Sub::Sub<int>(&local_1a0,(string *)local_3b0,&local_43c);
    local_438 = (undefined8 *)&local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"cases","");
    local_e8 = &local_d8;
    if (local_438 == (undefined8 *)&local_428) {
      uStack_d0 = uStack_420;
    }
    else {
      local_e8 = local_438;
    }
    local_d8 = CONCAT71(uStack_427,local_428);
    local_e0 = local_430;
    local_430 = 0;
    local_428 = 0;
    local_438 = (undefined8 *)&local_428;
    local_c8 = (long *)operator_new(0x20);
    *local_c8 = (long)&oneof;
    local_c8[1] = (long)&p_local;
    local_c8[2] = (long)local_4d0;
    *(undefined1 *)(local_c8 + 3) = 0;
    local_b0 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_invoke;
    uStack_c0 = 0;
    local_b8 = std::
               _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:931:7)>
               ::_M_manager;
    local_a8 = 1;
    local_a0 = local_90;
    local_98 = 0;
    local_90[0] = 0;
    local_80 = 0;
    std::__cxx11::string::_M_replace((ulong)&local_a0,0,(char *)0x0,0x1258832);
    local_38 = 0;
    io::Printer::Emit(pPVar10,&field,4,0x28d,
                      "\n              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {\n                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];\n                const bool oneof_needs_init = oneof_to_case != oneof_from_case;\n                if (oneof_needs_init) {\n                  if (oneof_to_case != 0) {\n                    _this->clear_$name$();\n                  }\n                  _this->$oneof_case$[$index$] = oneof_from_case;\n                }\n\n                switch (oneof_from_case) {\n                  $cases$;\n                  case $NAME$_NOT_SET:\n                    break;\n                }\n              }\n            "
                     );
    lVar27 = 0x2e0;
    do {
      if (*(char *)((long)&__end3.descriptor + lVar27) == '\x01') {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_358 + lVar27));
      }
      if ((long *)(local_378 + lVar27 + 8) != *(long **)(local_378 + lVar27 + -8)) {
        operator_delete(*(long **)(local_378 + lVar27 + -8),*(long *)(local_378 + lVar27 + 8) + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr
        [*(byte *)((long)&local_388.super_LogMessage.errno_saver_.saved_errno_ + lVar27)]._M_data)
                (&local_4a9,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_3b0 + lVar27 + 8));
      plVar23 = (long *)((long)&__begin3.descriptor + lVar27);
      *(undefined1 *)((long)&local_388.super_LogMessage.errno_saver_.saved_errno_ + lVar27) = 0xff;
      plVar7 = *(long **)((long)&local_3e0.field_2 + lVar27 + 8);
      if (plVar23 != plVar7) {
        operator_delete(plVar7,*plVar23 + 1);
      }
      lVar27 = lVar27 + -0xb8;
    } while (lVar27 != 0);
    if (local_438 != (undefined8 *)&local_428) {
      operator_delete(local_438,CONCAT71(uStack_427,local_428) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b0._0_8_ != &local_3a0) {
      operator_delete((void *)local_3b0._0_8_,local_3a0._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)v.storage_._0_8_ != &local_470) {
      operator_delete((void *)v.storage_._0_8_,
                      CONCAT71(local_470._M_allocated_capacity._1_7_,local_470._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_400._M_dataplus._M_p != &local_400.field_2) {
      operator_delete(local_400._M_dataplus._M_p,local_400.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3e0._M_dataplus._M_p != &local_3e0.field_2) {
      operator_delete(local_3e0._M_dataplus._M_p,local_3e0.field_2._M_allocated_capacity + 1);
    }
    __begin3.idx = __begin3.idx + 1;
  }
  if (local_4d0->num_weak_fields_ != 0) {
    format_09._M_str = "_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);\n";
    format_09._M_len = 0x3a;
    io::Printer::
    FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (format.printer_,
               (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )ZEXT816(0),&format.vars_,format_09);
  }
  if (0 < local_4d0->descriptor_->extension_range_count_) {
    io::Printer::Emit(p_local,0,0,0x52,
                      "\n      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);\n    "
                     );
  }
  format_10._M_str =
       "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._internal_metadata_);\n";
  format_10._M_len = 0x57;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_10);
  io::Printer::Outdent(format.printer_);
  format_11._M_str = "}\n";
  format_11._M_len = 2;
  io::Printer::
  FormatInternal<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (format.printer_,
             (Span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )ZEXT816(0),&format.vars_,format_11);
  std::
  vector<google::protobuf::compiler::cpp::FieldChunk,_std::allocator<google::protobuf::compiler::cpp::FieldChunk>_>
  ::~vector(&chunks);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~raw_hash_set((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)&format.vars_);
  return;
}

Assistant:

void MessageGenerator::GenerateClassSpecificMergeImpl(io::Printer* p) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  // Generate the class-specific MergeFrom, which avoids the ABSL_CHECK and
  // cast.
  Formatter format(p);
  format(
      "void $classname$::MergeImpl($pb$::MessageLite& to_msg, const "
      "$pb$::MessageLite& from_msg) {\n"
      "$WeakDescriptorSelfPin$"
      "  auto* const _this = static_cast<$classname$*>(&to_msg);\n"
      "  auto& from = static_cast<const $classname$&>(from_msg);\n");
  format.Indent();
  if (RequiresArena(GeneratorFunction::kMergeFrom)) {
    p->Emit(R"cc(
      $pb$::Arena* arena = _this->GetArena();
    )cc");
  }
  format(
      "$annotate_mergefrom$"
      "// @@protoc_insertion_point(class_specific_merge_from_start:"
      "$full_name$)\n");
  format("$DCHK$_NE(&from, _this);\n");

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "(void) cached_has_bits;\n\n");

  if (ShouldSplit(descriptor_, options_)) {
    format(
        "if (ABSL_PREDICT_FALSE(!from.IsSplitMessageDefault())) {\n"
        "  _this->PrepareSplitMessageForWrite();\n"
        "}\n");
  }

  std::vector<FieldChunk> chunks = CollectFields(
      optimized_order_, options_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return HasByteIndex(a) == HasByteIndex(b) &&
               IsLikelyPresent(a, options_) == IsLikelyPresent(b, options_) &&
               ShouldSplit(a, options_) == ShouldSplit(b, options_);
      });

  auto it = chunks.begin();
  auto end = chunks.end();
  // cached_has_word_index maintains that:
  //   cached_has_bits = from._has_bits_[cached_has_word_index]
  // for cached_has_word_index >= 0
  int cached_has_word_index = -1;
  while (it != end) {
    auto next = FindNextUnequalChunk(it, end, MayGroupChunksForHaswordsCheck);
    bool has_haswords_check =
        MaybeEmitHaswordsCheck(it, next, options_, has_bit_indices_,
                               cached_has_word_index, "from.", p);

    while (it != next) {
      const std::vector<const FieldDescriptor*>& fields = it->fields;
      const bool cache_has_bits = HasByteIndex(fields.front()) != kNoHasbit;
      const bool check_has_byte = cache_has_bits && fields.size() > 1 &&
                                  !IsLikelyPresent(fields.back(), options_);

      DebugAssertUniformLikelyPresence(fields, options_);

      if (cache_has_bits &&
          cached_has_word_index != HasWordIndex(fields.front())) {
        cached_has_word_index = HasWordIndex(fields.front());
        format("cached_has_bits = from.$has_bits$[$1$];\n",
               cached_has_word_index);
      }

      if (check_has_byte) {
        // Emit an if() that will let us skip the whole chunk if none are set.
        uint32_t chunk_mask = GenChunkMask(fields, has_bit_indices_);

        // Check (up to) 8 has_bits at a time if we have more than one field in
        // this chunk.  Due to field layout ordering, we may check
        // _has_bits_[last_chunk * 8 / 32] multiple times.
        ABSL_DCHECK_LE(2, popcnt(chunk_mask));
        ABSL_DCHECK_GE(8, popcnt(chunk_mask));

        format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForGroup(
                                   chunk_mask, fields, options_));
        format.Indent();
      }

      // Go back and emit merging code for each of the fields we processed.
      for (const auto* field : fields) {
        const auto& generator = field_generators_.get(field);

        if (field->is_repeated()) {
          generator.GenerateMergingCode(p);
        } else if (!field->is_required() && !field->is_repeated() &&
                   !HasHasbit(field)) {
          // Merge semantics without true field presence: primitive fields are
          // merged only if non-zero (numeric) or non-empty (string).
          MayEmitMutableIfNonDefaultCheck(
              p, "from.", field, ShouldSplit(field, options_), options_,
              /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
              /*with_enclosing_braces_always=*/true);
        } else if (field->options().weak() ||
                   cached_has_word_index != HasWordIndex(field)) {
          // Check hasbit, not using cached bits.
          auto v = p->WithVars(HasBitVars(field));
          format(
              "if ((from.$has_bits$[$has_array_index$] & $has_mask$) != 0) "
              "{\n");
          format.Indent();
          generator.GenerateMergingCode(p);
          format.Outdent();
          format("}\n");
        } else {
          // Check hasbit, using cached bits.
          ABSL_CHECK(HasHasbit(field));
          int has_bit_index = has_bit_indices_[field->index()];
          format("if ($1$) {\n", GenerateConditionMaybeWithProbabilityForField(
                                     has_bit_index, field, options_));
          format.Indent();

          if (GetFieldHasbitMode(field) == HasbitMode::kHintHasbit) {
            // Merge semantics without true field presence: primitive fields are
            // merged only if non-zero (numeric) or non-empty (string).
            MayEmitMutableIfNonDefaultCheck(
                p, "from.", field, ShouldSplit(field, options_), options_,
                /*emit_body=*/[&]() { generator.GenerateMergingCode(p); },
                /*with_enclosing_braces_always=*/false);
          } else {
            ABSL_DCHECK(GetFieldHasbitMode(field) == HasbitMode::kTrueHasbit);
            if (check_has_byte && IsPOD(field)) {
              generator.GenerateCopyConstructorCode(p);
            } else {
              generator.GenerateMergingCode(p);
            }
          }

          format.Outdent();
          format("}\n");
        }
      }

      if (check_has_byte) {
        format.Outdent();
        format("}\n");
      }

      // To next chunk.
      ++it;
    }

    if (has_haswords_check) {
      p->Outdent();
      p->Emit(R"cc(
        }
      )cc");

      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  if (HasBitsSize() == 1) {
    // Optimization to avoid a load. Assuming that most messages have fewer than
    // 32 fields, this seems useful.
    p->Emit(R"cc(
      _this->$has_bits$[0] |= cached_has_bits;
    )cc");
  } else if (HasBitsSize() > 1) {
    p->Emit(R"cc(
      _this->$has_bits$.Or(from.$has_bits$);
    )cc");
  }

  // Merge oneof fields. Oneof field requires oneof case check.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit({{"name", oneof->name()},
             {"NAME", absl::AsciiStrToUpper(oneof->name())},
             {"index", oneof->index()},
             {"cases",
              [&] {
                for (const auto* field : FieldRange(oneof)) {
                  p->Emit(
                      {{"Label", UnderscoresToCamelCase(field->name(), true)},
                       {"body",
                        [&] {
                          field_generators_.get(field).GenerateMergingCode(p);
                        }}},
                      R"cc(
                        case k$Label$: {
                          $body$;
                          break;
                        }
                      )cc");
                }
              }}},
            R"cc(
              if (const uint32_t oneof_from_case = from.$oneof_case$[$index$]) {
                const uint32_t oneof_to_case = _this->$oneof_case$[$index$];
                const bool oneof_needs_init = oneof_to_case != oneof_from_case;
                if (oneof_needs_init) {
                  if (oneof_to_case != 0) {
                    _this->clear_$name$();
                  }
                  _this->$oneof_case$[$index$] = oneof_from_case;
                }

                switch (oneof_from_case) {
                  $cases$;
                  case $NAME$_NOT_SET:
                    break;
                }
              }
            )cc");
  }
  if (num_weak_fields_) {
    format(
        "_this->$weak_field_map$.MergeFrom(from.$weak_field_map$);"
        "\n");
  }

  // Merging of extensions and unknown fields is done last, to maximize
  // the opportunity for tail calls.
  if (descriptor_->extension_range_count() > 0) {
    p->Emit(R"cc(
      _this->$extensions$.MergeFrom(&default_instance(), from.$extensions$);
    )cc");
  }

  format(
      "_this->_internal_metadata_.MergeFrom<$unknown_fields_type$>(from._"
      "internal_"
      "metadata_);\n");

  format.Outdent();
  format("}\n");
}